

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cc
# Opt level: O1

unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> __thiscall
flow::lang::Parser::compoundStmt(Parser *this)

{
  long lVar1;
  undefined8 uVar2;
  _Head_base<0UL,_flow::lang::Symbol_*,_false> _Var3;
  CompoundStmt *this_00;
  pointer *__ptr;
  pointer __p;
  long in_RSI;
  unique_ptr<flow::lang::VariableSym,_std::default_delete<flow::lang::VariableSym>_> var;
  SourceLocation sloc;
  _Head_base<0UL,_flow::lang::Symbol_*,_false> local_78;
  _Head_base<0UL,_flow::lang::Symbol_*,_false> local_70;
  _Base_ptr local_68;
  _Base_ptr local_60;
  _Base_ptr local_58 [2];
  __uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_> local_48;
  SymbolTable *pSStack_40;
  Runtime *local_38;
  
  lVar1 = *(long *)(in_RSI + 0x30);
  local_68 = (_Base_ptr)local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,*(long *)(lVar1 + 0x68),
             *(long *)(lVar1 + 0x70) + *(long *)(lVar1 + 0x68));
  local_38 = *(Runtime **)(lVar1 + 0x98);
  local_48._M_t.super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>
  .super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl =
       ((__uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_> *)
       (lVar1 + 0x88))->_M_t;
  pSStack_40 = *(SymbolTable **)(lVar1 + 0x90);
  Lexer::nextToken(*(Lexer **)(in_RSI + 0x30));
  this_00 = (CompoundStmt *)operator_new(0x60);
  (this_00->super_Stmt).super_ASTNode._vptr_ASTNode = (_func_int **)&PTR__ASTNode_0019d690;
  (this_00->super_Stmt).super_ASTNode.location_.filename._M_dataplus._M_p =
       (pointer)&(this_00->super_Stmt).super_ASTNode.location_.filename.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this_00->super_Stmt).super_ASTNode.location_,local_68,
             (long)&local_60->_M_color + (long)local_68);
  *(Runtime **)&(this_00->super_Stmt).super_ASTNode.location_.end.column = local_38;
  *(tuple<flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_> *)
   &(this_00->super_Stmt).super_ASTNode.location_.begin =
       local_48._M_t.
       super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>.
       super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl;
  *(SymbolTable **)&(this_00->super_Stmt).super_ASTNode.location_.begin.offset = pSStack_40;
  (this_00->super_Stmt).super_ASTNode._vptr_ASTNode = (_func_int **)&PTR__CompoundStmt_0019dbd0;
  (this_00->scope_)._M_t.
  super___uniq_ptr_impl<flow::lang::SymbolTable,_std::default_delete<flow::lang::SymbolTable>_>._M_t
  .super__Tuple_impl<0UL,_flow::lang::SymbolTable_*,_std::default_delete<flow::lang::SymbolTable>_>.
  super__Head_base<0UL,_flow::lang::SymbolTable_*,_false>._M_head_impl = (SymbolTable *)0x0;
  (this_00->statements_).
  super__List_base<std::unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>,_std::allocator<std::unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this_00->statements_;
  (this_00->statements_).
  super__List_base<std::unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>,_std::allocator<std::unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this_00->statements_;
  (this_00->statements_).
  super__List_base<std::unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>,_std::allocator<std::unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>_>_>
  ._M_impl._M_node._M_size = 0;
  do {
    if (*(int *)(*(long *)(in_RSI + 0x30) + 0xa0) != 0x37) goto LAB_00129c68;
    varDecl((Parser *)&local_78);
    _Var3._M_head_impl = local_78._M_head_impl;
    if (local_78._M_head_impl == (Symbol *)0x0) {
      *(undefined8 *)&(this->features_)._M_t._M_impl = 0;
    }
    else {
      local_78._M_head_impl = (Symbol *)0x0;
      local_70._M_head_impl = _Var3._M_head_impl;
      SymbolTable::appendSymbol
                (*(SymbolTable **)(in_RSI + 0x38),
                 (unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_> *)
                 &local_70);
      if (local_70._M_head_impl != (Symbol *)0x0) {
        (*((local_70._M_head_impl)->super_ASTNode)._vptr_ASTNode[1])();
      }
      local_70._M_head_impl = (Symbol *)0x0;
    }
    if (local_78._M_head_impl != (Symbol *)0x0) {
      (*((local_78._M_head_impl)->super_ASTNode)._vptr_ASTNode[1])();
    }
  } while (_Var3._M_head_impl != (Symbol *)0x0);
  goto LAB_00129ccf;
  while( true ) {
    stmt((Parser *)&local_78);
    _Var3._M_head_impl = local_78._M_head_impl;
    if (local_78._M_head_impl == (Symbol *)0x0) {
      *(undefined8 *)&(this->features_)._M_t._M_impl = 0;
    }
    else {
      CompoundStmt::push_back
                (this_00,(unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> *)
                         &local_78);
    }
    if (local_78._M_head_impl != (Symbol *)0x0) {
      (*((local_78._M_head_impl)->super_ASTNode)._vptr_ASTNode[1])();
    }
    if (_Var3._M_head_impl == (Symbol *)0x0) break;
LAB_00129c68:
    if ((*(Lexer **)(in_RSI + 0x30))->token_ == End) {
      Lexer::nextToken(*(Lexer **)(in_RSI + 0x30));
      lVar1 = *(long *)(in_RSI + 0x30);
      (this_00->super_Stmt).super_ASTNode.location_.end.offset = *(uint *)(lVar1 + 100);
      uVar2 = *(undefined8 *)(lVar1 + 0x5c);
      (this_00->super_Stmt).super_ASTNode.location_.end.line = (int)uVar2;
      (this_00->super_Stmt).super_ASTNode.location_.end.column = (int)((ulong)uVar2 >> 0x20);
      *(CompoundStmt **)&(this->features_)._M_t._M_impl = this_00;
      this_00 = (CompoundStmt *)0x0;
      break;
    }
  }
LAB_00129ccf:
  if (this_00 != (CompoundStmt *)0x0) {
    (*(this_00->super_Stmt).super_ASTNode._vptr_ASTNode[1])(this_00);
  }
  if (local_68 != (_Base_ptr)local_58) {
    operator_delete(local_68,(ulong)((long)&local_58[0]->_M_color + 1));
  }
  return (__uniq_ptr_data<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>,_true,_true>)
         (__uniq_ptr_data<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Stmt> Parser::compoundStmt() {
  SourceLocation sloc(location());
  nextToken();  // '{'

  std::unique_ptr<CompoundStmt> cs = std::make_unique<CompoundStmt>(sloc);

  while (token() == Token::Var) {
    if (std::unique_ptr<VariableSym> var = varDecl())
      currentScope()->appendSymbol(std::move(var));
    else
      return nullptr;
  }

  for (;;) {
    if (consumeIf(Token::End)) {
      cs->location().update(end());
      return std::unique_ptr<Stmt>(cs.release());
    }

    if (std::unique_ptr<Stmt> s = stmt())
      cs->push_back(std::move(s));
    else
      return nullptr;
  }
}